

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

void GlobOpt::AssertCanCopyPropOrCSEFieldLoad(Instr *instr)

{
  OpCode OVar1;
  Opnd *this;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  uint uVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *pJVar7;
  
  OVar1 = instr->m_opcode;
  if (OVar1 < LdSuperFld) {
    if (((0x2e < OVar1 - 0x5e) || ((0x40c000015501U >> ((ulong)(OVar1 - 0x5e) & 0x3f) & 1) == 0)) &&
       (OVar1 != LdLen_A)) goto LAB_004a1ee5;
  }
  else {
    uVar5 = (uint)OVar1;
    if (uVar5 < 500) {
      if ((0x10 < uVar5 - 0x121) || ((0x10005U >> (uVar5 - 0x121 & 0x1f) & 1) == 0))
      goto LAB_004a1ee5;
    }
    else if ((2 < OVar1 - 500) && ((uVar5 != 0x270 && (OVar1 != CheckPropertyGuardAndLoadType)))) {
LAB_004a1ee5:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x2db,
                         "(instr->m_opcode == Js::OpCode::LdSlot || instr->m_opcode == Js::OpCode::LdSlotArr || instr->m_opcode == Js::OpCode::LdFld || instr->m_opcode == Js::OpCode::LdFldForCallApplyTarget || instr->m_opcode == Js::OpCode::LdLen_A || instr->m_opcode == Js::OpCode::LdRootFld || instr->m_opcode == Js::OpCode::LdSuperFld || instr->m_opcode == Js::OpCode::LdFldForTypeOf || instr->m_opcode == Js::OpCode::LdRootFldForTypeOf || instr->m_opcode == Js::OpCode::LdMethodFld || instr->m_opcode == Js::OpCode::LdMethodFldPolyInlineMiss || instr->m_opcode == Js::OpCode::LdRootMethodFld || instr->m_opcode == Js::OpCode::LdMethodFromFlags || instr->m_opcode == Js::OpCode::ScopedLdMethodFld || instr->m_opcode == Js::OpCode::CheckFixedFld || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType || instr->m_opcode == Js::OpCode::ScopedLdFld || instr->m_opcode == Js::OpCode::ScopedLdFldForTypeOf)"
                         ,
                         "instr->m_opcode == Js::OpCode::LdSlot || instr->m_opcode == Js::OpCode::LdSlotArr || instr->m_opcode == Js::OpCode::LdFld || instr->m_opcode == Js::OpCode::LdFldForCallApplyTarget || instr->m_opcode == Js::OpCode::LdLen_A || instr->m_opcode == Js::OpCode::LdRootFld || instr->m_opcode == Js::OpCode::LdSuperFld || instr->m_opcode == Js::OpCode::LdFldForTypeOf || instr->m_opcode == Js::OpCode::LdRootFldForTypeOf || instr->m_opcode == Js::OpCode::LdMethodFld || instr->m_opcode == Js::OpCode::LdMethodFldPolyInlineMiss || instr->m_opcode == Js::OpCode::LdRootMethodFld || instr->m_opcode == Js::OpCode::LdMethodFromFlags || instr->m_opcode == Js::OpCode::ScopedLdMethodFld || instr->m_opcode == Js::OpCode::CheckFixedFld || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType || instr->m_opcode == Js::OpCode::ScopedLdFld || instr->m_opcode == Js::OpCode::ScopedLdFldForTypeOf"
                        );
      if (!bVar3) goto LAB_004a2154;
      *puVar6 = 0;
    }
  }
  if ((instr->m_opcode != CheckFixedFld) && (instr->m_dst->m_type != TyVar)) {
    pJVar7 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    bVar3 = JITTimeFunctionBody::IsAsmJsMode(pJVar7);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x2dd,
                         "(instr->m_opcode == Js::OpCode::CheckFixedFld || instr->GetDst()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode())"
                         ,
                         "instr->m_opcode == Js::OpCode::CheckFixedFld || instr->GetDst()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode()"
                        );
      if (!bVar3) goto LAB_004a2154;
      *puVar6 = 0;
    }
  }
  if (instr->m_src1->m_type != TyVar) {
    pJVar7 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    bVar3 = JITTimeFunctionBody::IsAsmJsMode(pJVar7);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x2de,
                         "(instr->GetSrc1()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode())"
                         ,
                         "instr->GetSrc1()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode()"
                        );
      if (!bVar3) goto LAB_004a2154;
      *puVar6 = 0;
    }
  }
  this = instr->m_src1;
  OVar4 = IR::Opnd::GetKind(this);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) goto LAB_004a2154;
    *puVar6 = 0;
  }
  if (*(char *)((long)this[1]._vptr_Opnd + 0x14) != '\x02') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x2df,"(instr->GetSrc1()->AsSymOpnd()->m_sym->IsPropertySym())",
                       "instr->GetSrc1()->AsSymOpnd()->m_sym->IsPropertySym()");
    if (!bVar3) goto LAB_004a2154;
    *puVar6 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x2e0,"(instr->GetSrc2() == nullptr)","instr->GetSrc2() == nullptr");
    if (!bVar3) {
LAB_004a2154:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void
GlobOpt::AssertCanCopyPropOrCSEFieldLoad(IR::Instr * instr)
{
    // Consider: Hoisting LdRootFld may have complication with exception if the field doesn't exist.
    // We need to have another opcode for the hoisted version to avoid the exception and bailout.

    Assert(instr->m_opcode == Js::OpCode::LdSlot || instr->m_opcode == Js::OpCode::LdSlotArr
        || instr->m_opcode == Js::OpCode::LdFld || instr->m_opcode == Js::OpCode::LdFldForCallApplyTarget
        || instr->m_opcode == Js::OpCode::LdLen_A
        || instr->m_opcode == Js::OpCode::LdRootFld  || instr->m_opcode == Js::OpCode::LdSuperFld
        || instr->m_opcode == Js::OpCode::LdFldForTypeOf || instr->m_opcode == Js::OpCode::LdRootFldForTypeOf
        || instr->m_opcode == Js::OpCode::LdMethodFld || instr->m_opcode == Js::OpCode::LdMethodFldPolyInlineMiss
        || instr->m_opcode == Js::OpCode::LdRootMethodFld
        || instr->m_opcode == Js::OpCode::LdMethodFromFlags
        || instr->m_opcode == Js::OpCode::ScopedLdMethodFld
        || instr->m_opcode == Js::OpCode::CheckFixedFld
        || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType
        || instr->m_opcode == Js::OpCode::ScopedLdFld
        || instr->m_opcode == Js::OpCode::ScopedLdFldForTypeOf);

    Assert(instr->m_opcode == Js::OpCode::CheckFixedFld || instr->GetDst()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(instr->GetSrc1()->GetType() == TyVar || instr->m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(instr->GetSrc1()->AsSymOpnd()->m_sym->IsPropertySym());
    Assert(instr->GetSrc2() == nullptr);
}